

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restraint.hpp
# Opt level: O0

void __thiscall OpenMD::Restraint::Restraint(Restraint *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Restraint_004e65e8;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::map((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
         *)0x1fa8f6);
  return;
}

Assistant:

Restraint() :
        twist0_(0.0), swingX0_(0.0), swingY0_(0.0), posZ0_(0.0),
        printRest_(false), restType_(0) {}